

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::ReallocBuffer(FString *this,size_t newlen)

{
  char *__src;
  FStringData *pFVar1;
  
  __src = this->Chars;
  if (1 < *(int *)(__src + -4)) {
    pFVar1 = FStringData::Alloc(newlen);
    this->Chars = (char *)(pFVar1 + 1);
    pFVar1->Len = (uint)newlen;
    if (*(uint *)(__src + -0xc) < newlen) {
      newlen = (ulong)*(uint *)(__src + -0xc);
    }
    memcpy(pFVar1 + 1,__src,newlen);
    *(undefined1 *)((long)&pFVar1[1].Len + newlen) = 0;
    FStringData::Release((FStringData *)(__src + -0xc));
    return;
  }
  if (*(uint *)(__src + -8) < newlen) {
    pFVar1 = FStringData::Realloc((FStringData *)(__src + -0xc),newlen);
    this->Chars = (char *)(pFVar1 + 1);
  }
  *(uint *)(this->Chars + -0xc) = (uint)newlen;
  return;
}

Assistant:

void FString::ReallocBuffer (size_t newlen)
{
	if (Data()->RefCount > 1)
	{ // If more than one reference, we must use a new copy
		FStringData *old = Data();
		AllocBuffer (newlen);
		StrCopy (Chars, old->Chars(), newlen < old->Len ? newlen : old->Len);
		old->Release();
	}
	else
	{
		if (newlen > Data()->AllocLen)
		{
			Chars = (char *)(Data()->Realloc(newlen) + 1);
		}
		Data()->Len = (unsigned int)newlen;
	}
}